

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.h
# Opt level: O0

string * __thiscall
cmGlobalUnixMakefileGenerator3::GetName_abi_cxx11_
          (string *__return_storage_ptr__,cmGlobalUnixMakefileGenerator3 *this)

{
  cmGlobalUnixMakefileGenerator3 *this_local;
  
  GetActualName_abi_cxx11_();
  return __return_storage_ptr__;
}

Assistant:

std::string GetName() const CM_OVERRIDE
  {
    return cmGlobalUnixMakefileGenerator3::GetActualName();
  }